

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

int __thiscall ghc::filesystem::path::compare(path *this,value_type *s)

{
  int iVar1;
  size_t sVar2;
  long *local_40 [2];
  long local_30 [2];
  
  sVar2 = strlen(s);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,s,s + sVar2);
  postprocess_path_with_format((path *)local_40,(format)s);
  iVar1 = compare(this,(path *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return iVar1;
}

Assistant:

GHC_INLINE int path::compare(const value_type* s) const
{
    return compare(path(s));
}